

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O0

void __thiscall amrex::IArrayBox::readFrom(IArrayBox *this,istream *is)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  istream *in_RSI;
  BaseFab<int> *in_RDI;
  int tmp_ncomp;
  Box tmp_box;
  IntDescriptor data_descriptor;
  string type;
  string *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Box *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff34;
  int N;
  string *this_02;
  int local_b8 [4];
  Box *in_stack_ffffffffffffff58;
  istream *in_stack_ffffffffffffff60;
  IntDescriptor local_98;
  undefined1 local_81 [33];
  string local_60 [48];
  string local_30 [32];
  istream *local_10;
  
  this_02 = local_30;
  local_10 = in_RSI;
  std::__cxx11::string::string(this_02);
  std::operator>>(local_10,this_02);
  bVar1 = std::operator!=(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  N = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff34);
  if (bVar1) {
    in_stack_ffffffffffffff28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),
               "IArrayBox::readFrom: IFAB is expected, but instead we have ",
               (allocator *)in_stack_ffffffffffffff28);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    Error(in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
  }
  IntDescriptor::IntDescriptor(&local_98);
  amrex::operator>>((istream *)in_stack_ffffffffffffff28,(IntDescriptor *)in_stack_ffffffffffffff20)
  ;
  this_01 = (Box *)(local_b8 + 1);
  Box::Box(this_01);
  amrex::operator>>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::istream::operator>>(local_10,local_b8);
  std::istream::ignore((long)local_10,99999);
  BaseFab<int>::box(in_RDI);
  bVar1 = Box::operator!=(this_01,(Box *)in_stack_ffffffffffffff18);
  if ((bVar1) || (iVar2 = BaseFab<int>::nComp(in_RDI), iVar2 != local_b8[0])) {
    resize((IArrayBox *)this_02,(Box *)in_RDI,N,(Arena *)in_stack_ffffffffffffff28);
  }
  this_00 = std::unique_ptr<amrex::IFABio,_std::default_delete<amrex::IFABio>_>::operator->
                      ((unique_ptr<amrex::IFABio,_std::default_delete<amrex::IFABio>_> *)0xfe0227);
  IFABio::read(this_00,(int)local_10,in_RDI,(size_t)&local_98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
IArrayBox::readFrom (std::istream& is)
{
    std::string type;
    is >> type;
    if (type != "IFAB") {
        amrex::Error(std::string("IArrayBox::readFrom: IFAB is expected, but instead we have ")
                     +type);
    }

    IntDescriptor data_descriptor;
    is >> data_descriptor;

    Box tmp_box;
    int tmp_ncomp;
    is >> tmp_box;
    is >> tmp_ncomp;
    is.ignore(99999, '\n');

    if (this->box() != tmp_box || this->nComp() != tmp_ncomp) {
        this->resize(tmp_box, tmp_ncomp);
    }

#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        IArrayBox hostfab(this->box(), this->nComp(), The_Pinned_Arena());
        ifabio->read(is, hostfab, data_descriptor);
        Gpu::htod_memcpy_async(this->dataPtr(), hostfab.dataPtr(),
                               hostfab.size()*sizeof(IArrayBox::value_type));
        Gpu::streamSynchronize();
    } else
#endif
    {
        ifabio->read(is, *this, data_descriptor);
    }
}